

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_double_&,_const_double_&> * __thiscall
Catch::ExprLhs<double_const&>::operator>=
          (BinaryExpr<const_double_&,_const_double_&> *__return_storage_ptr__,
          ExprLhs<double_const&> *this,double *rhs)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  StringRef local_30;
  
  pdVar3 = *(double **)this;
  dVar1 = *pdVar3;
  dVar2 = *rhs;
  StringRef::StringRef(&local_30,">=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = dVar2 <= dVar1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00570518;
  __return_storage_ptr__->m_lhs = pdVar3;
  (__return_storage_ptr__->m_op).m_start = local_30.m_start;
  (__return_storage_ptr__->m_op).m_size = local_30.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator >= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs >= rhs), m_lhs, ">=", rhs };
        }